

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devextra.c
# Opt level: O0

void do_supps(CHAR_DATA *ch,char *argument)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  CClass *pCVar6;
  uint *puVar7;
  char *in_RSI;
  long in_RDI;
  char buf [4608];
  bool found;
  bool fAll;
  int mana;
  int max_lev;
  int min_lev;
  int level;
  int sn;
  char spell_columns [52];
  char spell_list [52] [4608];
  char arg [4608];
  BUFFER *buffer;
  CHAR_DATA *in_stack_fffffffffffc3368;
  skill_type *in_stack_fffffffffffc3370;
  CHAR_DATA *in_stack_fffffffffffc3378;
  int in_stack_fffffffffffc3380;
  int in_stack_fffffffffffc3384;
  BUFFER *in_stack_fffffffffffc3388;
  char *in_stack_fffffffffffc3390;
  char *in_stack_fffffffffffc3398;
  int iStack_3ba68;
  int iStack_3ba64;
  int iStack_3ba60;
  int iStack_3ba5c;
  char acStack_3ba58 [64];
  char acStack_3ba18 [239616];
  char local_1218 [4608];
  BUFFER *local_18;
  char *local_10;
  long local_8;
  
  iStack_3ba64 = 1;
  iStack_3ba68 = 0x33;
  bVar2 = false;
  local_10 = in_RSI;
  local_8 = in_RDI;
  bVar3 = is_npc(in_stack_fffffffffffc3368);
  if (!bVar3) {
    pCVar6 = char_data::Class((char_data *)
                              CONCAT44(in_stack_fffffffffffc3384,in_stack_fffffffffffc3380));
    if ((pCVar6->ctype == 2) || (bVar3 = is_immortal(in_stack_fffffffffffc3368), bVar3)) {
      if ((*local_10 != '\0') &&
         (bVar3 = str_prefix(in_stack_fffffffffffc3398,in_stack_fffffffffffc3390), bVar3)) {
        local_10 = one_argument((char *)in_stack_fffffffffffc3370,(char *)in_stack_fffffffffffc3368)
        ;
        bVar3 = is_number((char *)in_stack_fffffffffffc3368);
        if (!bVar3) {
          send_to_char((char *)CONCAT44(in_stack_fffffffffffc3384,in_stack_fffffffffffc3380),
                       in_stack_fffffffffffc3378);
          return;
        }
        iVar4 = atoi(local_1218);
        if ((iVar4 < 1) || (0x33 < iVar4)) {
          sprintf(&stack0xfffffffffffc3388,"Levels must be between 1 and %d.\n\r",0x33);
          send_to_char((char *)CONCAT44(in_stack_fffffffffffc3384,in_stack_fffffffffffc3380),
                       in_stack_fffffffffffc3378);
          return;
        }
        iStack_3ba68 = iVar4;
        if (*local_10 != '\0') {
          local_10 = one_argument((char *)in_stack_fffffffffffc3370,
                                  (char *)in_stack_fffffffffffc3368);
          bVar3 = is_number((char *)in_stack_fffffffffffc3368);
          if (!bVar3) {
            send_to_char((char *)CONCAT44(in_stack_fffffffffffc3384,in_stack_fffffffffffc3380),
                         in_stack_fffffffffffc3378);
            return;
          }
          iStack_3ba68 = atoi(local_1218);
          if ((iStack_3ba68 < 1) || (0x33 < iStack_3ba68)) {
            sprintf(&stack0xfffffffffffc3388,"Levels must be between 1 and %d.\n\r",0x33);
            send_to_char((char *)CONCAT44(in_stack_fffffffffffc3384,in_stack_fffffffffffc3380),
                         in_stack_fffffffffffc3378);
            return;
          }
          iStack_3ba64 = iVar4;
          if (iStack_3ba68 < iVar4) {
            send_to_char((char *)CONCAT44(in_stack_fffffffffffc3384,in_stack_fffffffffffc3380),
                         in_stack_fffffffffffc3378);
            return;
          }
        }
      }
      for (iStack_3ba60 = 0; iStack_3ba60 < 0x34; iStack_3ba60 = iStack_3ba60 + 1) {
        acStack_3ba58[iStack_3ba60] = '\0';
        acStack_3ba18[(long)iStack_3ba60 * 0x1200] = '\0';
      }
      iStack_3ba5c = 0;
      while ((iStack_3ba5c < 800 && (skill_table[iStack_3ba5c].name != (char *)0x0))) {
        in_stack_fffffffffffc3378 = (CHAR_DATA *)(skill_table + iStack_3ba5c);
        pCVar6 = char_data::Class((char_data *)
                                  CONCAT44(in_stack_fffffffffffc3384,in_stack_fffffffffffc3380));
        iVar4 = CClass::GetIndex(pCVar6);
        iVar4 = (int)*(short *)((long)&in_stack_fffffffffffc3378->next_in_room + (long)iVar4 * 2);
        if ((((iVar4 < 0x34) &&
             (((iStack_3ba64 <= iVar4 && (iVar4 <= iStack_3ba68)) &&
              (skill_table[iStack_3ba5c].spell_fun != spell_null)))) &&
            (0 < *(short *)(*(long *)(local_8 + 0xc0) + 1000 + (long)iStack_3ba5c * 2))) &&
           ((skill_table[iStack_3ba5c].ctype == 2 || (skill_table[iStack_3ba5c].ctype == 4)))) {
          bVar2 = true;
          in_stack_fffffffffffc3370 = skill_table + iStack_3ba5c;
          pCVar6 = char_data::Class((char_data *)
                                    CONCAT44(in_stack_fffffffffffc3384,in_stack_fffffffffffc3380));
          iVar4 = CClass::GetIndex(pCVar6);
          uVar5 = (uint)in_stack_fffffffffffc3370->skill_level[iVar4];
          if ((int)*(short *)(local_8 + 0x138) < (int)uVar5) {
            sprintf(&stack0xfffffffffffc3388,"%-18s n/a      ",skill_table[iStack_3ba5c].name);
          }
          else {
            in_stack_fffffffffffc3384 = (int)skill_table[iStack_3ba5c].min_mana;
            in_stack_fffffffffffc3380 =
                 (int)(100 / (long)(int)((*(short *)(local_8 + 0x138) + 2) - uVar5));
            puVar7 = (uint *)std::max<int>((int *)&stack0xfffffffffffc3384,
                                           (int *)&stack0xfffffffffffc3380);
            sprintf(&stack0xfffffffffffc3388,"%-18s  %3d mana  ",skill_table[iStack_3ba5c].name,
                    (ulong)*puVar7);
          }
          if (acStack_3ba18[(long)(int)uVar5 * 0x1200] == '\0') {
            sprintf(acStack_3ba18 + (long)(int)uVar5 * 0x1200,"\n\rLevel %2d: %s",(ulong)uVar5,
                    &stack0xfffffffffffc3388);
          }
          else {
            cVar1 = acStack_3ba58[(int)uVar5];
            acStack_3ba58[(int)uVar5] = cVar1 + '\x01';
            if ((int)(char)(cVar1 + '\x01') % 2 == 0) {
              strcat(acStack_3ba18 + (long)(int)uVar5 * 0x1200,"\n\r          ");
            }
            strcat(acStack_3ba18 + (long)(int)uVar5 * 0x1200,&stack0xfffffffffffc3388);
          }
        }
        iStack_3ba5c = iStack_3ba5c + 1;
      }
      if (bVar2) {
        local_18 = new_buf();
        for (iStack_3ba60 = 0; iStack_3ba60 < 0x34; iStack_3ba60 = iStack_3ba60 + 1) {
          if (acStack_3ba18[(long)iStack_3ba60 * 0x1200] != '\0') {
            add_buf(in_stack_fffffffffffc3388,
                    (char *)CONCAT44(in_stack_fffffffffffc3384,in_stack_fffffffffffc3380));
          }
        }
        add_buf(in_stack_fffffffffffc3388,
                (char *)CONCAT44(in_stack_fffffffffffc3384,in_stack_fffffffffffc3380));
        buf_string(local_18);
        page_to_char((char *)in_stack_fffffffffffc3370,in_stack_fffffffffffc3368);
        free_buf((BUFFER *)0x65f6d1);
      }
      else {
        send_to_char((char *)CONCAT44(in_stack_fffffffffffc3384,in_stack_fffffffffffc3380),
                     in_stack_fffffffffffc3378);
      }
    }
    else {
      send_to_char((char *)CONCAT44(in_stack_fffffffffffc3384,in_stack_fffffffffffc3380),
                   in_stack_fffffffffffc3378);
    }
  }
  return;
}

Assistant:

void do_supps(CHAR_DATA *ch, char *argument)
{
	BUFFER *buffer;
	char arg[MAX_INPUT_LENGTH];
	char spell_list[LEVEL_HERO + 1][MAX_STRING_LENGTH];
	char spell_columns[LEVEL_HERO + 1];
	int sn, level, min_lev = 1, max_lev = LEVEL_HERO, mana;
	bool fAll= false, found= false;
	char buf[MAX_STRING_LENGTH];

	if (is_npc(ch))
		return;

	if (ch->Class()->ctype != CLASS_COMMUNER && !is_immortal(ch))
	{
		send_to_char("Your class knows no prayers.\n\r", ch);
		return;
	}

	if (argument[0] != '\0')
	{
		fAll = true;

		if (str_prefix(argument, "all"))
		{
			argument = one_argument(argument, arg);

			if (!is_number(arg))
			{
				send_to_char("Arguments must be numerical or all.\n\r", ch);
				return;
			}

			max_lev = atoi(arg);

			if (max_lev < 1 || max_lev > LEVEL_HERO)
			{
				sprintf(buf, "Levels must be between 1 and %d.\n\r", LEVEL_HERO);
				send_to_char(buf, ch);
				return;
			}

			if (argument[0] != '\0')
			{
				argument = one_argument(argument, arg);
				if (!is_number(arg))
				{
					send_to_char("Arguments must be numerical or all.\n\r", ch);
					return;
				}

				min_lev = max_lev;
				max_lev = atoi(arg);

				if (max_lev < 1 || max_lev > LEVEL_HERO)
				{
					sprintf(buf, "Levels must be between 1 and %d.\n\r", LEVEL_HERO);
					send_to_char(buf, ch);
					return;
				}

				if (min_lev > max_lev)
				{
					send_to_char("That would be silly.\n\r", ch);
					return;
				}
			}
		}
	}

	/* initialize data */
	for (level = 0; level < LEVEL_HERO + 1; level++)
	{
		spell_columns[level] = 0;
		spell_list[level][0] = '\0';
	}

	for (sn = 0; sn < MAX_SKILL; sn++)
	{
		if (skill_table[sn].name == nullptr)
			break;

		level = skill_table[sn].skill_level[ch->Class()->GetIndex()];

		if (level < LEVEL_HERO + 1
			&& level >= min_lev
			&& level <= max_lev
			&& skill_table[sn].spell_fun != spell_null
			&& ch->pcdata->learned[sn] > 0
			&& (skill_table[sn].ctype == CMD_COMMUNE || skill_table[sn].ctype == CMD_BOTH))
		{
			found = true;
			level = skill_table[sn].skill_level[ch->Class()->GetIndex()];

			if (ch->level < level)
			{
				sprintf(buf, "%-18s n/a      ", skill_table[sn].name);
			}
			else
			{
				mana = std::max((int)skill_table[sn].min_mana, 100 / (2 + ch->level - level));
				sprintf(buf, "%-18s  %3d mana  ", skill_table[sn].name, mana);
			}

			if (spell_list[level][0] == '\0')
			{
				sprintf(spell_list[level], "\n\rLevel %2d: %s", level, buf);
			}
			else /* append */
			{
				if (++spell_columns[level] % 2 == 0)
					strcat(spell_list[level], "\n\r          ");

				strcat(spell_list[level], buf);
			}
		}
	}

	/* return results */

	if (!found)
	{
		send_to_char("No spells found.\n\r", ch);
		return;
	}

	buffer = new_buf();

	for (level = 0; level < LEVEL_HERO + 1; level++)
	{
		if (spell_list[level][0] != '\0')
			add_buf(buffer, spell_list[level]);
	}

	add_buf(buffer, "\n\r");
	page_to_char(buf_string(buffer), ch);
	free_buf(buffer);
}